

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Learn.cpp
# Opt level: O1

int __thiscall Qclass::detAction(Qclass *this,int state)

{
  double dVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  iVar3 = rand();
  if (iVar3 % 100 < 0x51) {
    uVar4 = (long)state * 0x20;
    uVar5 = 0;
    dVar6 = -10000.0;
    do {
      dVar1 = this->Q[state][uVar5];
      uVar2 = uVar4;
      if (dVar6 <= dVar1) {
        uVar2 = uVar5;
      }
      uVar4 = uVar2 & 0xffffffff;
      iVar3 = (int)uVar2;
      dVar6 = (double)(-(ulong)(dVar1 < dVar6) & (ulong)dVar6 |
                      ~-(ulong)(dVar1 < dVar6) & (ulong)dVar1);
      uVar5 = uVar5 + 1;
    } while (uVar5 != 4);
  }
  else {
    iVar3 = rand();
    iVar3 = iVar3 % 4;
  }
  return iVar3;
}

Assistant:

int Qclass::detAction(int state) {
  int action;
  int chosenAction;
  int temp = rand() % 100;
  if (temp > 80) {   // Randomly explores for an action 20% of the time
    int randAction = rand() % 4;
    chosenAction = randAction;
  } else {
    double maxQ = -10000;
    for (int i = 0; i < 4; i++) {
      if (Q[state][i] >= maxQ) {
        maxQ = Q[state][i];
        chosenAction = i;
      }
    }
  }
  action = chosenAction;
  return action;
}